

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cc
# Opt level: O0

fdb_status fdb_end_transaction(fdb_file_handle *fhandle,fdb_commit_opt_t opt)

{
  fdb_kvs_handle *handle_00;
  file_status_t fVar1;
  list_elem *plVar2;
  long *in_RDI;
  fdb_status fs;
  filemgr *file;
  fdb_kvs_handle *handle;
  file_status_t fstatus;
  fdb_kvs_handle *in_stack_00000078;
  bool in_stack_00000096;
  fdb_commit_opt_t in_stack_00000097;
  fdb_kvs_handle *in_stack_00000098;
  fdb_txn *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  fdb_status local_4;
  
  if ((in_RDI == (long *)0x0) || (*in_RDI == 0)) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    handle_00 = (fdb_kvs_handle *)*in_RDI;
    if (handle_00->txn == (fdb_txn *)0x0) {
      local_4 = FDB_RESULT_TRANSACTION_FAIL;
    }
    else if ((handle_00->kvs == (kvs_info *)0x0) || (handle_00->kvs->type != '\x01')) {
      local_4 = FDB_RESULT_SUCCESS;
      plVar2 = list_begin(handle_00->txn->items);
      if (plVar2 != (list_elem *)0x0) {
        local_4 = _fdb_commit(in_stack_00000098,in_stack_00000097,in_stack_00000096);
      }
      if (local_4 == FDB_RESULT_SUCCESS) {
        while( true ) {
          fdb_check_file_reopen(handle_00,(file_status_t *)0x0);
          filemgr_mutex_lock((filemgr *)0x17274d);
          fdb_sync_db_header(in_stack_00000078);
          fVar1 = filemgr_get_file_status((filemgr *)0x172761);
          if (fVar1 != '\x04') break;
          filemgr_mutex_unlock((filemgr *)0x172779);
        }
        wal_remove_transaction
                  ((filemgr *)CONCAT44(local_4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8)
        ;
        free(handle_00->txn->items);
        free(handle_00->txn->wrapper);
        free(handle_00->txn);
        handle_00->txn = (fdb_txn *)0x0;
        filemgr_mutex_unlock((filemgr *)0x1727f0);
      }
    }
    else {
      local_4 = FDB_RESULT_INVALID_HANDLE;
    }
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_end_transaction(fdb_file_handle *fhandle,
                               fdb_commit_opt_t opt)
{
    if (!fhandle || !fhandle->root) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    file_status_t fstatus;
    fdb_kvs_handle *handle = fhandle->root;
    struct filemgr *file;

    if (handle->txn == NULL) {
        // there is no transaction started
        return FDB_RESULT_TRANSACTION_FAIL;
    }
    if (handle->kvs) {
        if (handle->kvs->type == KVS_SUB) {
            // deny transaction on sub handle
            return FDB_RESULT_INVALID_HANDLE;
        }
    }

    fdb_status fs = FDB_RESULT_SUCCESS;
    if (list_begin(handle->txn->items)) {
        fs = _fdb_commit(handle, opt,
                       !(handle->config.durability_opt & FDB_DRB_ASYNC));
    }

    if (fs == FDB_RESULT_SUCCESS) {

        do { // repeat until file status is not REMOVED_PENDING
            fdb_check_file_reopen(handle, NULL);

            file = handle->file;
            filemgr_mutex_lock(file);
            fdb_sync_db_header(handle);

            fstatus = filemgr_get_file_status(file);
            if (fstatus == FILE_REMOVED_PENDING) {
                // we must not commit transaction on this file
                // file status was changed by other thread .. start over
                filemgr_mutex_unlock(file);
            }
        } while (fstatus == FILE_REMOVED_PENDING);

        wal_remove_transaction(file, handle->txn);

        free(handle->txn->items);
        free(handle->txn->wrapper);
        free(handle->txn);
        handle->txn = NULL;

        filemgr_mutex_unlock(file);
    }

    return fs;
}